

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

void j2k_read_cod(opj_j2k_t *j2k)

{
  opj_cio_t *cio;
  opj_image_t *poVar1;
  opj_codestream_info_t *poVar2;
  uint uVar3;
  OPJ_PROG_ORDER OVar4;
  int pos;
  int *piVar5;
  OPJ_UINT32 *pOVar6;
  ulong uVar7;
  opj_codestream_info_t *cstr_info;
  long lVar8;
  opj_tcp_t *poVar9;
  ulong uVar10;
  
  cio = j2k->cio;
  if (j2k->state == 0x10) {
    poVar9 = j2k->cp->tcps + j2k->curtileno;
  }
  else {
    poVar9 = j2k->default_tcp;
  }
  poVar1 = j2k->image;
  cio_read(cio,2);
  uVar3 = cio_read(cio,1);
  poVar9->csty = uVar3;
  OVar4 = cio_read(cio,1);
  poVar9->prg = OVar4;
  uVar3 = cio_read(cio,2);
  poVar9->numlayers = uVar3;
  uVar3 = cio_read(cio,1);
  poVar9->mct = uVar3;
  pos = cio_tell(cio);
  uVar7 = (ulong)poVar1->numcomps;
  if (poVar1->numcomps != 0) {
    lVar8 = 0;
    uVar10 = 0;
    do {
      *(uint *)((long)poVar9->tccps->stepsizes + lVar8 + -0x1c) = poVar9->csty & 1;
      cio_seek(cio,pos);
      j2k_read_cox(j2k,(int)uVar10);
      uVar10 = uVar10 + 1;
      uVar7 = (ulong)poVar1->numcomps;
      lVar8 = lVar8 + 0x438;
    } while (uVar10 < uVar7);
  }
  poVar2 = j2k->cstr_info;
  if (poVar2 != (opj_codestream_info_t *)0x0) {
    poVar2->prog = poVar9->prg;
    poVar2->numlayers = poVar9->numlayers;
    piVar5 = (int *)malloc(uVar7 << 2);
    poVar2->numdecompos = piVar5;
    if (poVar1->numcomps != 0) {
      pOVar6 = &poVar9->tccps->numresolutions;
      uVar7 = 0;
      do {
        piVar5[uVar7] = *pOVar6 - 1;
        uVar7 = uVar7 + 1;
        pOVar6 = pOVar6 + 0x10e;
      } while (uVar7 < poVar1->numcomps);
    }
  }
  return;
}

Assistant:

static void j2k_read_cod(opj_j2k_t *j2k) {
	int len, i, pos;
	
	opj_cio_t *cio = j2k->cio;
	opj_cp_t *cp = j2k->cp;
	opj_tcp_t *tcp = j2k->state == J2K_STATE_TPH ? &cp->tcps[j2k->curtileno] : j2k->default_tcp;
	opj_image_t *image = j2k->image;
	
	len = cio_read(cio, 2);				/* Lcod */
	tcp->csty = cio_read(cio, 1);		/* Scod */
	tcp->prg = (OPJ_PROG_ORDER)cio_read(cio, 1);		/* SGcod (A) */
	tcp->numlayers = cio_read(cio, 2);	/* SGcod (B) */
	tcp->mct = cio_read(cio, 1);		/* SGcod (C) */
	
	pos = cio_tell(cio);
	for (i = 0; i < image->numcomps; i++) {
		tcp->tccps[i].csty = tcp->csty & J2K_CP_CSTY_PRT;
		cio_seek(cio, pos);
		j2k_read_cox(j2k, i);
	}

	/* Index */
	if (j2k->cstr_info) {
		opj_codestream_info_t *cstr_info = j2k->cstr_info;
		cstr_info->prog = tcp->prg;
		cstr_info->numlayers = tcp->numlayers;
		cstr_info->numdecompos = (int*) opj_malloc(image->numcomps * sizeof(int));
		for (i = 0; i < image->numcomps; i++) {
			cstr_info->numdecompos[i] = tcp->tccps[i].numresolutions - 1;
		}
	}
}